

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEEE754PluginTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_FE_with_Plugin_should_not_fail_again_when_test_has_already_failed_TestShell::createTest
          (TEST_FE_with_Plugin_should_not_fail_again_when_test_has_already_failed_TestShell *this)

{
  TEST_FE_with_Plugin_should_not_fail_again_when_test_has_already_failed_Test *this_00;
  
  this_00 = (TEST_FE_with_Plugin_should_not_fail_again_when_test_has_already_failed_Test *)
            operator_new(0x60,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/IEEE754PluginTest.cpp"
                         ,0x73);
  TEST_FE_with_Plugin_should_not_fail_again_when_test_has_already_failed_Test::
  TEST_FE_with_Plugin_should_not_fail_again_when_test_has_already_failed_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(FE_with_Plugin, should_not_fail_again_when_test_has_already_failed)
{
    fixture.setTestFunction(set_everything_but_already_failed);
    fixture.runAllTests();
    CHECK(IEEE754ExceptionsPlugin::checkIeee754OverflowExceptionFlag());
    CHECK(IEEE754ExceptionsPlugin::checkIeee754UnderflowExceptionFlag());
    CHECK(IEEE754ExceptionsPlugin::checkIeee754InexactExceptionFlag());
    CHECK(IEEE754ExceptionsPlugin::checkIeee754DivByZeroExceptionFlag());
    LONGS_EQUAL(1, fixture.getCheckCount());
    LONGS_EQUAL(1, fixture.getFailureCount());
}